

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

uint * __thiscall
CAPSFile::ExtractDensity
          (CAPSFile *this,uchar *buffer,int density_buf_size,uint ctype,uint cyl,uint head)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int i;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  bool bVar14;
  char buff [128];
  char acStack_b8 [136];
  
  uVar12 = (ulong)(uint)density_buf_size;
  uVar3 = ExtractInt(buffer + 4);
  puVar4 = (uint *)operator_new__((ulong)(uVar3 & 0xfffffffc));
  puVar13 = (uint *)((ulong)(uVar3 & 0xfffffffc) + (long)puVar4);
LAB_00158a0e:
  do {
    if (puVar13 <= puVar4) {
      if (cyl == 0x12) {
        for (uVar12 = 0; uVar3 >> 2 != uVar12; uVar12 = uVar12 + 1) {
          if (puVar4[uVar12] - 0x11 < 0xfffffffc) {
            sprintf(acStack_b8," index = %i - Valeur = %2.2X ",uVar12 & 0xffffffff);
          }
        }
      }
      return puVar4;
    }
    iVar6 = (int)uVar12;
    uVar12 = (ulong)(iVar6 - 1);
    bVar1 = buffer[uVar12];
    switch(bVar1 & 3) {
    case 0:
      if ((bVar1 & 8) == 0) {
        iVar6 = (bVar1 >> 4) + 1;
      }
      else {
        uVar12 = (ulong)(iVar6 - 2);
        iVar6 = CONCAT31((int3)(((uint)bVar1 << 4) >> 8),buffer[uVar12]);
      }
      iVar8 = (int)uVar12;
      if ((bVar1 & 4) == 0) {
        while (bVar14 = iVar6 != 0, iVar6 = iVar6 + -1, bVar14) {
          uVar12 = (ulong)((int)uVar12 - 1);
          puVar13[-1] = (uint)buffer[uVar12];
          puVar13 = puVar13 + -1;
        }
      }
      else {
        for (lVar10 = 0; iVar9 = (int)lVar10, iVar6 * 4 + iVar9 != 0; lVar10 = lVar10 + -4) {
          *(uint *)((long)puVar13 + lVar10 + -4) =
               (uint)buffer[(uint)(iVar8 + -4 + iVar9)] |
               ((uint)buffer[(uint)(iVar8 + -3 + iVar9)] |
               (uint)buffer[(uint)(iVar8 + -2 + iVar9)] << 8 |
               (uint)buffer[(uint)(iVar8 + -1 + iVar9)] << 0x10) << 8;
        }
        puVar13 = (uint *)((long)puVar13 + lVar10);
        uVar12 = (ulong)(uint)(iVar8 + iVar9);
      }
      goto LAB_00158a0e;
    case 1:
      uVar5 = (ulong)((bVar1 >> 2) + 1);
      uVar12 = (ulong)(iVar6 - 2);
      uVar7 = (ulong)buffer[uVar12] + 1;
      goto LAB_00158a9c;
    case 2:
      uVar5 = (ulong)((bVar1 >> 2) + 1);
      uVar2 = buffer[iVar6 - 2];
      uVar11 = iVar6 - 3;
      break;
    case 3:
      uVar5 = CONCAT71((int7)(((ulong)bVar1 << 6) >> 8),buffer[iVar6 - 2]);
      uVar2 = buffer[iVar6 - 3];
      uVar11 = iVar6 - 4;
    }
    uVar12 = (ulong)uVar11;
    uVar7 = (ulong)CONCAT11(uVar2,buffer[uVar12]);
LAB_00158a9c:
    while (iVar6 = (int)uVar5, uVar5 = (ulong)(iVar6 - 1), iVar6 != 0) {
      puVar13[-1] = puVar13[uVar7 - 1];
      puVar13 = puVar13 + -1;
    }
  } while( true );
}

Assistant:

unsigned int* CAPSFile::ExtractDensity(unsigned char* buffer, int density_buf_size, DWORD ctype, DWORD cyl, DWORD head)
{
   unsigned int usize = ExtractInt(&buffer[4]);
   unsigned int ucrc = ExtractInt(&buffer[8]);; // CRC on uncompressed data
   unsigned int csize = ExtractInt(&buffer[12]);; // compressed size in bytes
   unsigned int ccrc = ExtractInt(&buffer[16]);; // CRC on compressed data
   unsigned int hcrc = ExtractInt(&buffer[20]);; // CRC on header calculated as hcrc=0

   // density
   unsigned int* buf = new unsigned int[usize >> 2];

   // Ptr to end of buffer
   unsigned int* mem = &buf[usize >> 2];
   unsigned int offset_source = density_buf_size;

   // Decode data :
   while (mem > buf)
   {
      int size, ofs = 0;
      unsigned char cb0 = buffer[--offset_source];

      switch (cb0 & 0x03)
      {
      case 0x0: // data block
         // 14 or 4 bit size
         if (cb0 & 0x8)
         {
            size = ((cb0 << 4) & 0xF00) | (buffer[--offset_source]);
         }
         else
         {
            size = (cb0 >> 4) + 1;
         }
         if (cb0 & 0x4)
         {
            // 4 byte per value
            while (size--)
            {
               unsigned int data;
               data = buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               *--mem = data;
            }
         }
         else
         {
            while (size--)
            {
               *--mem = buffer[--offset_source];
            }
         }
         continue;

      case 0x1: // copy block, 8bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source] + 1;
         break;
      case 0x2: // copy block, 16 bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      case 0x3: // Copy block, 16 bit offset, 14 bit size
         size = ((cb0 << 6) & 0x3F00) | buffer[--offset_source];
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      }

      while (size--)
      {
         mem--;
         *mem = mem[ofs];
      }
   }


   if (cyl == 0x12)
   {
      int nbDens = (usize >> 2);
      for (int i = 0; i < nbDens; i++)
      {
         if (buf[i] >= 0x11 || buf[i] <= 0x0C)
         {
            char buff[128];
            sprintf(buff, " index = %i - Valeur = %2.2X ", i, buf[i]);
            OutputDebugString (buff);
         }
      }
   }

   return buf;
}